

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtMidi.cpp
# Opt level: O2

void __thiscall MidiOutAlsa::sendMessage(MidiOutAlsa *this,uchar *message,size_t size)

{
  undefined8 *puVar1;
  int iVar2;
  void *pvVar3;
  ulong uVar4;
  string *psVar5;
  uint uVar6;
  snd_seq_event_t ev;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  puVar1 = (undefined8 *)(this->super_MidiOutApi).super_MidiApi.apiData_;
  uVar6 = (uint)size;
  if (*(uint *)(puVar1 + 4) < uVar6) {
    *(uint *)(puVar1 + 4) = uVar6;
    iVar2 = snd_midi_event_resize_buffer(puVar1[3],size & 0xffffffff);
    if (iVar2 != 0) {
      psVar5 = &(this->super_MidiOutApi).super_MidiApi.errorString_;
      std::__cxx11::string::assign((char *)psVar5);
      std::__cxx11::string::string((string *)&local_80,(string *)psVar5);
      MidiApi::error((MidiApi *)this,DRIVER_ERROR,&local_80);
      psVar5 = &local_80;
      goto LAB_0010dd68;
    }
    free((void *)puVar1[5]);
    pvVar3 = malloc((ulong)*(uint *)(puVar1 + 4));
    puVar1[5] = pvVar3;
    if (pvVar3 == (void *)0x0) {
      psVar5 = &(this->super_MidiOutApi).super_MidiApi.errorString_;
      std::__cxx11::string::assign((char *)psVar5);
      std::__cxx11::string::string((string *)&local_a0,(string *)psVar5);
      MidiApi::error((MidiApi *)this,MEMORY_ERROR,&local_a0);
      psVar5 = &local_a0;
      goto LAB_0010dd68;
    }
  }
  ev.data.raw32.d[0] = 0;
  ev.data.ext.ptr = (void *)0x0;
  ev.time.time.tv_nsec = 0;
  ev.source.client = '\0';
  ev.source.port = *(uchar *)((long)puVar1 + 0xc);
  ev.dest.client = 0xfe;
  ev.dest.port = 0xfd;
  ev._0_8_ = 0xfd000000;
  for (uVar4 = 0; (size & 0xffffffff) != uVar4; uVar4 = uVar4 + 1) {
    *(uchar *)(puVar1[5] + uVar4) = message[uVar4];
  }
  iVar2 = snd_midi_event_encode(puVar1[3],puVar1[5],size & 0xffffffff,&ev);
  if (iVar2 < (int)uVar6) {
    psVar5 = &(this->super_MidiOutApi).super_MidiApi.errorString_;
    std::__cxx11::string::assign((char *)psVar5);
    std::__cxx11::string::string((string *)&local_40,(string *)psVar5);
    MidiApi::error((MidiApi *)this,WARNING,&local_40);
    psVar5 = &local_40;
  }
  else {
    iVar2 = snd_seq_event_output(*puVar1,&ev);
    if (-1 < iVar2) {
      snd_seq_drain_output(*puVar1);
      return;
    }
    psVar5 = &(this->super_MidiOutApi).super_MidiApi.errorString_;
    std::__cxx11::string::assign((char *)psVar5);
    std::__cxx11::string::string((string *)&local_60,(string *)psVar5);
    MidiApi::error((MidiApi *)this,WARNING,&local_60);
    psVar5 = &local_60;
  }
LAB_0010dd68:
  std::__cxx11::string::~string((string *)psVar5);
  return;
}

Assistant:

void MidiOutAlsa :: sendMessage( const unsigned char *message, size_t size )
{
  int result;
  AlsaMidiData *data = static_cast<AlsaMidiData *> (apiData_);
  unsigned int nBytes = static_cast<unsigned int> (size);
  if ( nBytes > data->bufferSize ) {
    data->bufferSize = nBytes;
    result = snd_midi_event_resize_buffer( data->coder, nBytes );
    if ( result != 0 ) {
      errorString_ = "MidiOutAlsa::sendMessage: ALSA error resizing MIDI event buffer.";
      error( RtMidiError::DRIVER_ERROR, errorString_ );
      return;
    }
    free (data->buffer);
    data->buffer = (unsigned char *) malloc( data->bufferSize );
    if ( data->buffer == NULL ) {
      errorString_ = "MidiOutAlsa::initialize: error allocating buffer memory!\n\n";
      error( RtMidiError::MEMORY_ERROR, errorString_ );
      return;
    }
  }

  snd_seq_event_t ev;
  snd_seq_ev_clear( &ev );
  snd_seq_ev_set_source( &ev, data->vport );
  snd_seq_ev_set_subs( &ev );
  snd_seq_ev_set_direct( &ev );
  for ( unsigned int i=0; i<nBytes; ++i ) data->buffer[i] = message[i];
  result = snd_midi_event_encode( data->coder, data->buffer, (long)nBytes, &ev );
  if ( result < (int)nBytes ) {
    errorString_ = "MidiOutAlsa::sendMessage: event parsing error!";
    error( RtMidiError::WARNING, errorString_ );
    return;
  }

  // Send the event.
  result = snd_seq_event_output( data->seq, &ev );
  if ( result < 0 ) {
    errorString_ = "MidiOutAlsa::sendMessage: error sending MIDI message to port.";
    error( RtMidiError::WARNING, errorString_ );
    return;
  }
  snd_seq_drain_output( data->seq );
}